

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FoldingSet.cpp
# Opt level: O2

void __thiscall llvm::FoldingSetBase::InsertNode(FoldingSetBase *this,Node *N,void *InsertPos)

{
  uint uVar1;
  void *pvVar2;
  FoldingSetNodeID TempID;
  SmallVectorImpl<unsigned_int> local_b0;
  undefined1 local_a0 [128];
  
  if (N->NextInFoldingSetBucket == (void *)0x0) {
    uVar1 = this->NumNodes + 1;
    if (this->NumBuckets * 2 < uVar1) {
      GrowHashTable(this);
      local_b0.super_SmallVectorTemplateBase<unsigned_int,_true>.
      super_SmallVectorTemplateCommon<unsigned_int,_void>.super_SmallVectorBase.BeginX = local_a0;
      local_b0.super_SmallVectorTemplateBase<unsigned_int,_true>.
      super_SmallVectorTemplateCommon<unsigned_int,_void>.super_SmallVectorBase.Size = 0;
      local_b0.super_SmallVectorTemplateBase<unsigned_int,_true>.
      super_SmallVectorTemplateCommon<unsigned_int,_void>.super_SmallVectorBase.Capacity = 0x20;
      uVar1 = (*this->_vptr_FoldingSetBase[3])(this,N,&local_b0);
      InsertPos = this->Buckets + (this->NumBuckets - 1 & uVar1);
      SmallVectorImpl<unsigned_int>::~SmallVectorImpl(&local_b0);
      uVar1 = this->NumNodes + 1;
    }
    this->NumNodes = uVar1;
    pvVar2 = (void *)((ulong)InsertPos | 1);
    if (*InsertPos != (void *)0x0) {
      pvVar2 = *InsertPos;
    }
    N->NextInFoldingSetBucket = pvVar2;
    *(Node **)InsertPos = N;
    return;
  }
  __assert_fail("!N->getNextInBucket()",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/FoldingSet.cpp"
                ,0x15c,"void llvm::FoldingSetBase::InsertNode(Node *, void *)");
}

Assistant:

void FoldingSetBase::InsertNode(Node *N, void *InsertPos) {
  assert(!N->getNextInBucket());
  // Do we need to grow the hashtable?
  if (NumNodes+1 > capacity()) {
    GrowHashTable();
    FoldingSetNodeID TempID;
    InsertPos = GetBucketFor(ComputeNodeHash(N, TempID), Buckets, NumBuckets);
  }

  ++NumNodes;

  /// The insert position is actually a bucket pointer.
  void **Bucket = static_cast<void**>(InsertPos);

  void *Next = *Bucket;

  // If this is the first insertion into this bucket, its next pointer will be
  // null.  Pretend as if it pointed to itself, setting the low bit to indicate
  // that it is a pointer to the bucket.
  if (!Next)
    Next = reinterpret_cast<void*>(reinterpret_cast<intptr_t>(Bucket)|1);

  // Set the node's next pointer, and make the bucket point to the node.
  N->SetNextInBucket(Next);
  *Bucket = N;
}